

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createSIn(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long lVar1;
  long lVar2;
  BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *pBVar3;
  Value *rhs_local;
  Value *lhs_local;
  string local_60;
  string local_40 [32];
  
  rhs_local = rhs;
  lhs_local = lhs;
  if (lhs != (Value *)0x0) {
    lVar1 = __dynamic_cast(lhs,&Value::typeinfo,
                           &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    if (rhs != (Value *)0x0 && lVar1 != 0) {
      lVar2 = __dynamic_cast(rhs,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
      if (lVar2 != 0) {
        std::__cxx11::string::string((string *)&local_60,(string *)(lVar2 + 0x48));
        std::__cxx11::string::string(local_40,(string *)(lVar1 + 0x48));
        lVar2 = std::__cxx11::string::find((string *)&local_60,(ulong)local_40);
        lVar1 = 0x18;
        if (lVar2 == -1) {
          lVar1 = 0x68;
        }
        pBVar3 = (BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *)
                 ((long)&(this->program_->modules_).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar1);
        std::__cxx11::string::~string(local_40);
        goto LAB_0013c944;
      }
    }
  }
  makeName(&local_60,this,name);
  pBVar3 = insert<flow::BinaryInstr<(flow::BinaryOperator)31,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                     (this,&lhs_local,&rhs_local,&local_60);
LAB_0013c944:
  std::__cxx11::string::~string((string *)&local_60);
  return (Value *)pBVar3;
}

Assistant:

Value* IRBuilder::createSIn(Value* lhs, Value* rhs, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(b->get().find(a->get()) != std::string::npos);

  return insert<SInInstr>(lhs, rhs, makeName(name));
}